

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O3

void __thiscall
CVmDynamicFunc::restore_from_file
          (CVmDynamicFunc *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  char b_2 [2];
  char b [2];
  char b_1 [2];
  char buf [5];
  ushort local_4a;
  vm_obj_id_t local_48;
  ushort local_44;
  ushort local_42;
  ulong local_40;
  char local_35 [5];
  vm_val_t *val;
  
  local_48 = self;
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  CVmFile::read_bytes(fp,(char *)&local_44,2);
  uVar2 = (ulong)local_44;
  local_40 = uVar2;
  CVmFile::read_bytes(fp,(char *)&local_42,2);
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])
                    (G_mem_X->varheap_,uVar2 + (ulong)local_42 * 4 + 0x30,this);
  val = (vm_val_t *)CONCAT44(extraout_var,iVar1);
  *(uint *)&val[2].val = (uint)local_42;
  *(ulong *)(val + 2) = uVar2;
  val->typ = VM_NIL;
  val[1].typ = VM_NIL;
  (this->super_CVmObject).ext_ = (char *)val;
  CVmFile::read_bytes(fp,local_35,5);
  CVmObjFixup::fix_dh(fixups,local_35);
  val[1].typ = (int)local_35[0];
  vmb_get_dh_val(local_35,val + 1);
  CVmFile::read_bytes(fp,local_35,5);
  CVmObjFixup::fix_dh(fixups,local_35);
  val->typ = (int)local_35[0];
  vmb_get_dh_val(local_35,val);
  *(vm_obj_id_t *)((long)&val[2].val + (long)val[2].val.intval * 4 + 4) = local_48;
  iVar1 = val[2].val.intval;
  CVmFile::read_bytes(fp,(char *)(&val[3].typ + iVar1),local_40);
  if (local_42 != 0) {
    uVar2 = 0;
    do {
      CVmFile::read_bytes(fp,(char *)&local_4a,2);
      *(uint *)((long)&val[2].val + uVar2 * 4 + 4) = (uint)local_4a;
      CVmObjFixup::fix_vmb_obj(fixups,(char *)((long)(&val[3].typ + iVar1) + (ulong)local_4a));
      uVar2 = uVar2 + 1;
    } while (local_42 != uVar2);
  }
  return;
}

Assistant:

void CVmDynamicFunc::restore_from_file(VMG_ vm_obj_id_t self,
                                       CVmFile *fp, CVmObjFixup *fixups)
{
    char buf[VMB_DATAHOLDER];
    
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* read the bytecode length and object reference count */
    size_t bytecode_len = fp->read_uint2();
    int obj_ref_cnt = fp->read_uint2();

    /* allocate the extension */
    vm_dynfunc_ext *ext = vm_dynfunc_ext::alloc_ext(
        vmg_ this, bytecode_len, obj_ref_cnt);
    ext_ = (char *)ext;

    /* read the method context object */
    fp->read_bytes(buf, VMB_DATAHOLDER);
    fixups->fix_dh(vmg_ buf);
    vmb_get_dh(buf, &ext->method_ctx);

    /* read the source object */
    fp->read_bytes(buf, VMB_DATAHOLDER);
    fixups->fix_dh(vmg_ buf);
    vmb_get_dh(buf, &ext->src);

    /* set up the dynamic object code prefix header */
    vmb_put_objid(ext->get_prefix_ptr(), self);

    /* read the bytecode */
    char *bc = ext->get_bytecode_ptr();
    fp->read_bytes(bc, bytecode_len);

    /* read the object references, fixing each one up in the bytecode */
    for (int i = 0 ; i < obj_ref_cnt ; ++i)
    {
        /* read and save the offset of this reference */
        uint ofs = ext->obj_refs[i] = fp->read_uint2();

        /* fix up the object ID in the bytecode data */
        fixups->fix_vmb_obj(vmg_ bc + ofs);
    }
}